

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void SDL_QuitSubSystem(Uint32 sdl12flags)

{
  SDL12_Joystick *pSVar1;
  Uint32 UVar2;
  char *pcVar3;
  long lVar4;
  SDL20_GameControllerClose_t *pp_Var5;
  long lVar6;
  
  pcVar3 = (*SDL20_getenv)("SDL12COMPAT_NO_QUIT_VIDEO");
  if (pcVar3 != (char *)0x0) {
    lVar4 = (*SDL20_strtol)(pcVar3,(char **)0x0,10);
    if ((int)lVar4 != 0) {
      sdl12flags = sdl12flags & 0xffffffdf;
    }
  }
  if (((sdl12flags >> 8 & 1) != 0) && ((CDRomInit & 1) != 0)) {
    (*SDL20_free)(CDRomPath);
    CDRomPath = (char *)0x0;
    CDRomInit = 0;
  }
  if ((sdl12flags & 0x10) != 0) {
    SDL_CloseAudio();
  }
  if ((sdl12flags & 0x20) != 0) {
    KeyRepeatEvent.type = '\0';
    KeyRepeatNextTicks = 0;
    KeyRepeatDelay = 0;
    KeyRepeatInterval = 0;
    (*SDL20_FreeSurface)(VideoIcon20);
    VideoIcon20 = (SDL_Surface *)0x0;
    EndVidModeCreate();
    if (0 < VideoModesCount) {
      lVar6 = 0;
      lVar4 = 0;
      do {
        (*SDL20_free)(*(void **)((long)&VideoModes->modeslist12 + lVar6));
        (*SDL20_free)(*(void **)((long)&VideoModes->modes12 + lVar6));
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 0x18;
      } while (lVar4 < VideoModesCount);
    }
    (*SDL20_free)(VideoModes);
    (*SDL20_FreeFormat)(VideoInfoVfmt20);
    (*SDL20_memset)(&VideoInfo12,0,0x18);
    VideoInfoVfmt20 = (SDL_PixelFormat *)0x0;
    EventFilter12 = (SDL12_EventFilter)0x0;
    EventQueueTail = (EventQueueType *)0x0;
    EventQueueHead = (EventQueueType *)0x0;
    EventQueueAvailable = (EventQueueType *)0x0;
    (*SDL20_memset)(&PendingKeydownEvent,0,0x18);
    SDL_FreeCursor(CurrentCursor12);
    VideoModes = (VideoModeList *)0x0;
    VideoModesCount = 0;
    AllowThreadedDraws = SDL_FALSE;
    AllowThreadedPumps = SDL_FALSE;
    if (EventQueueMutex != (SDL_mutex *)0x0) {
      (*SDL20_DestroyMutex)(EventQueueMutex);
      EventQueueMutex = (SDL_mutex *)0x0;
    }
    EventThreadEnabled = SDL_FALSE;
  }
  if ((sdl12flags >> 9 & 1) != 0) {
    if (0 < NumJoysticks) {
      lVar4 = 0x10;
      lVar6 = 0;
      do {
        pSVar1 = JoystickList;
        pp_Var5 = &SDL20_GameControllerClose;
        if (JoysticksAreGameControllers == SDL_FALSE) {
          pp_Var5 = (SDL20_GameControllerClose_t *)&SDL20_JoystickClose;
        }
        (**pp_Var5)(*(SDL_GameController **)((long)&JoystickList->name + lVar4));
        (*SDL20_free)(*(void **)((long)pSVar1 + lVar4 + -0x10));
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x18;
      } while (lVar6 < NumJoysticks);
    }
    (*SDL20_free)(JoystickList);
    JoystickList = (SDL12_Joystick *)0x0;
    NumJoysticks = 0;
  }
  (*SDL20_QuitSubSystem)(sdl12flags & 0x100231);
  UVar2 = (*SDL20_WasInit)(0);
  if ((UVar2 == 0) && ((CDRomInit & 1) == 0)) {
    (*SDL20_Quit)();
  }
  InitializedSubsystems20 = InitializedSubsystems20 & (sdl12flags & 0x231 ^ 0xffefffff);
  return;
}

Assistant:

SDLCALL
SDL_QuitSubSystem(Uint32 sdl12flags)
{
    Uint32 sdl20flags, extraflags;

    /* Some games (notably the Steam build of Multiwinia), will
     * SDL_Quit(SDL_INIT_VIDEO) on resolution change, and never call
     * SDL_Init() again before creating their new window.
     */
    if (SDL12Compat_GetHintBoolean("SDL12COMPAT_NO_QUIT_VIDEO", SDL_FALSE)) {
        sdl12flags &= ~SDL12_INIT_VIDEO;
    }
    InitFlags12to20(sdl12flags, &sdl20flags, &extraflags);

    if (extraflags & SDL12_INIT_CDROM) {
        QuitCDSubsystem();
    }

    if (sdl12flags & SDL12_INIT_AUDIO) {
        SDL_CloseAudio();
    }

    if (sdl12flags & SDL12_INIT_VIDEO) {
        Quit12Video();
    }

    if (sdl12flags & SDL12_INIT_JOYSTICK) {
        Quit12Joystick();
    }

    SDL20_QuitSubSystem(sdl20flags);

    if ((SDL20_WasInit(0) == 0) && (!CDRomInit)) {
        SDL20_Quit();
    }

    InitializedSubsystems20 &= ~sdl20flags;
    InitializedSubsystems20 &= ~SDL_INIT_NOPARACHUTE;  /* SDL2 accepts this flag but ignores it. */
}